

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

bool __thiscall ON_V4V5_MeshNgonUserData::CopyFrom(ON_V4V5_MeshNgonUserData *this,ON_Object *src)

{
  bool bVar1;
  
  if (src == (ON_Object *)0x0) {
    return false;
  }
  bVar1 = ON_Object::IsKindOf(src,&m_ON_V4V5_MeshNgonUserData_class_rtti);
  if (bVar1) {
    operator=(this,(ON_V4V5_MeshNgonUserData *)src);
  }
  return bVar1;
}

Assistant:

ON_V4V5_MeshNgonUserData::ON_V4V5_MeshNgonUserData()
{
  m_userdata_uuid = ON_CLASS_ID(ON_V4V5_MeshNgonUserData);
  m_application_uuid = ON_opennurbs4_id;
  m_userdata_copycount = 1;
  m_ngon_list = 0;
  m_mesh_F_count = 0;
  m_mesh_V_count = 0;
}